

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  Result RVar1;
  function<wabt::Stream_*(wabt::string_view)> local_e8;
  undefined1 local_c8 [8];
  BinaryWriterSpec binary_writer_spec;
  WriteBinaryOptions *options_local;
  Script *script_local;
  WriteBinarySpecStreamFactory *module_stream_factory_local;
  Stream *json_stream_local;
  string_view source_filename_local;
  
  binary_writer_spec.num_modules_ = (size_t)options;
  std::function<wabt::Stream_*(wabt::string_view)>::function(&local_e8,module_stream_factory);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_c8,json_stream,&local_e8,source_filename,
             module_filename_noext,(WriteBinaryOptions *)binary_writer_spec.num_modules_);
  std::function<wabt::Stream_*(wabt::string_view)>::~function(&local_e8);
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript((BinaryWriterSpec *)local_c8,script);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec((BinaryWriterSpec *)local_c8);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             string_view source_filename,
                             string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}